

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  TestContext *pTVar2;
  RenderContext *pRVar3;
  Context *pCVar4;
  ContextInfo *pCVar5;
  _Alloc_hider _Var6;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  TestNode *node_03;
  TestNode *pTVar7;
  Texture2DFormatCase *pTVar8;
  TextureCubeFormatCase *pTVar9;
  Texture2DArrayFormatCase *pTVar10;
  Texture3DFormatCase *pTVar11;
  Texture2DFileCase *pTVar12;
  TextureCubeFileCase *pTVar13;
  undefined8 extraout_RAX;
  Compressed2DFormatCase *pCVar14;
  CompressedCubeFormatCase *pCVar15;
  undefined8 uVar16;
  int numStr;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  ulong local_110;
  string descriptionBase;
  string nameBase;
  allocator<char> local_b5;
  int local_b4;
  TestNode *local_b0;
  TestNode *local_a8;
  TestNode *local_a0;
  TestNode *local_98;
  long local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"unsized",
             "Unsized formats");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sized",
             "Sized formats");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"compressed",
             "Compressed formats");
  tcu::TestNode::addChild((TestNode *)this,node_01);
  node_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_02,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "Sized formats (2D)");
  tcu::TestNode::addChild(node_00,node_02);
  node_03 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_03,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Sized formats (Cubemap)");
  tcu::TestNode::addChild(node_00,node_03);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d_array",
             "Sized formats (2D Array)");
  local_b0 = pTVar7;
  tcu::TestNode::addChild(node_00,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x70);
  pcVar17 = "Sized formats (3D)";
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"3d",
             "Sized formats (3D)");
  local_98 = pTVar7;
  tcu::TestNode::addChild(node_00,pTVar7);
  lVar18 = 0;
  local_a8 = node_03;
  local_a0 = node_02;
  while( true ) {
    if (lVar18 == 0x80) break;
    dVar1 = *(deUint32 *)((long)&DAT_01e2d398 + lVar18);
    local_110 = (ulong)*(uint *)((long)&DAT_01e2d39c + lVar18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)((long)&DAT_01e2d390 + lVar18),
               (allocator<char> *)&descriptionBase);
    pcVar17 = glu::getTextureFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npotFilenames,pcVar17,(allocator<char> *)&local_70);
    std::operator+(&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,", ");
    local_90 = lVar18;
    pcVar17 = glu::getTypeName((int)local_110);
    std::operator+(&descriptionBase,&local_130,pcVar17);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&npotFilenames);
    pTVar8 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_2d_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D");
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar8,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,(deUint32)local_110,0x80,0x80
              );
    tcu::TestNode::addChild(node,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar8 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_2d_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D");
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar8,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,(deUint32)local_110,0x3f,0x70
              );
    tcu::TestNode::addChild(node,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar9 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_cube_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_CUBE_MAP");
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar9,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,(deUint32)local_110,0x40,0x40
              );
    tcu::TestNode::addChild(node,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar9 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_cube_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_CUBE_MAP");
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar9,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,(deUint32)local_110,0x39,0x39
              );
    tcu::TestNode::addChild(node,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar10 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_2d_array_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D_ARRAY");
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar10,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,(deUint32)local_110,0x40,0x40
               ,8);
    tcu::TestNode::addChild(node,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar10 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_2d_array_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D_ARRAY");
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar10,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,(deUint32)local_110,0x3f,0x39
               ,7);
    tcu::TestNode::addChild(node,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar11 = (Texture3DFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_3d_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_3D");
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar11,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,(deUint32)local_110,8,0x20,
               0x10);
    tcu::TestNode::addChild(node,(TestNode *)pTVar11);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar11 = (Texture3DFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_3d_npot");
    pcVar17 = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_3D");
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar11,pTVar2,pRVar3,pcVar17,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,(deUint32)local_110,0xb,0x1f,
               7);
    tcu::TestNode::addChild(node,(TestNode *)pTVar11);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&descriptionBase);
    std::__cxx11::string::~string((string *)&nameBase);
    lVar18 = local_90 + 0x10;
  }
  uVar19 = 8;
  while (uVar19 != 0x318) {
    dVar1 = *(deUint32 *)((long)&PTR_anon_var_dwarf_3206f1_01e2d410 + uVar19);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_01e2d408 + uVar19),
               (allocator<char> *)&descriptionBase);
    pcVar17 = glu::getTextureFormatName(dVar1);
    local_110 = uVar19;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar17,(allocator<char> *)&local_130);
    pTVar8 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D");
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar8,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x80,0x80);
    tcu::TestNode::addChild(local_a0,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar8 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D");
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar8,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x3f,0x70);
    tcu::TestNode::addChild(local_a0,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar9 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_CUBE_MAP");
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar9,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x40,0x40);
    tcu::TestNode::addChild(local_a8,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar9 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_CUBE_MAP");
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar9,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x39,0x39);
    tcu::TestNode::addChild(local_a8,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar10 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D_ARRAY");
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar10,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x40,0x40,8);
    tcu::TestNode::addChild(local_b0,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar10 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D_ARRAY");
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar10,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x3f,0x39,7);
    tcu::TestNode::addChild(local_b0,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar11 = (Texture3DFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_3D");
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar11,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,8,0x20,0x10);
    tcu::TestNode::addChild(local_98,(TestNode *)pTVar11);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar11 = (Texture3DFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_npot");
    pcVar17 = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_3D");
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar11,pTVar2,pRVar3,pcVar17,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0xb,0x1f,7);
    tcu::TestNode::addChild(local_98,(TestNode *)pTVar11);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&descriptionBase);
    std::__cxx11::string::~string((string *)&nameBase);
    uVar19 = local_110 + 0x10;
  }
  uVar19 = 8;
  while( true ) {
    numStr = (int)pcVar17;
    if (uVar19 == 0x58) break;
    dVar1 = *(deUint32 *)((long)&PTR_anon_var_dwarf_1902c2d_01e2d720 + uVar19);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_01e2d718 + uVar19),
               (allocator<char> *)&descriptionBase);
    pcVar17 = glu::getTextureFormatName(dVar1);
    local_110 = uVar19;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar17,(allocator<char> *)&local_130);
    pTVar8 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D");
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar8,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x80,0x80);
    tcu::TestNode::addChild(local_a0,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar8 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D");
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar8,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x3f,0x70);
    tcu::TestNode::addChild(local_a0,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar9 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_CUBE_MAP");
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar9,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x40,0x40);
    tcu::TestNode::addChild(local_a8,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar9 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_CUBE_MAP");
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar9,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x39,0x39);
    tcu::TestNode::addChild(local_a8,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar10 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D_ARRAY");
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar10,pTVar2,pRVar3,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x40,0x40,8);
    tcu::TestNode::addChild(local_b0,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pTVar10 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_130,&nameBase,"_npot");
    pcVar17 = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D_ARRAY");
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar10,pTVar2,pRVar3,pcVar17,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar1,0x3f,0x39,7);
    tcu::TestNode::addChild(local_b0,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&descriptionBase);
    std::__cxx11::string::~string((string *)&nameBase);
    uVar19 = local_110 + 0x10;
  }
  pTVar12 = (Texture2DFileCase *)operator_new(0xf8);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar4 = (this->super_TestCaseGroup).m_context;
  pRVar3 = pCVar4->m_renderCtx;
  pCVar5 = pCVar4->m_contextInfo;
  toStringVector_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nameBase,(Functional *)init::filenames,(char **)0x8,numStr);
  Texture2DFileCase::Texture2DFileCase
            (pTVar12,pTVar2,pRVar3,pCVar5,"etc1_2d_pot","GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nameBase);
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&nameBase);
  descriptionBase._M_dataplus._M_p = (pointer)0x0;
  descriptionBase._M_string_length = 0;
  descriptionBase.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nameBase,"data/etc1/photo_helsinki_113x89.pkm",(allocator<char> *)&local_130
            );
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&descriptionBase,
             &nameBase);
  std::__cxx11::string::~string((string *)&nameBase);
  pTVar12 = (Texture2DFileCase *)operator_new(0xf8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  Texture2DFileCase::Texture2DFileCase
            (pTVar12,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar4->m_renderCtx,pCVar4->m_contextInfo,"etc1_2d_npot",
             "GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&descriptionBase);
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&descriptionBase);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (local_b4 = 0; local_b4 < 7; local_b4 = local_b4 + 1) {
    for (lVar18 = 0; lVar18 != 0x30; lVar18 = lVar18 + 8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"data/etc1/skybox_",&local_b5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &npotFilenames,&local_70,*(char **)((long)init::faceExt + lVar18));
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &npotFilenames,"_mip_");
      de::toString<int>(&local_50,&local_b4);
      std::operator+(&descriptionBase,&local_130,&local_50);
      std::operator+(&nameBase,&descriptionBase,".pkm");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&potFilenames,
                 &nameBase);
      std::__cxx11::string::~string((string *)&nameBase);
      std::__cxx11::string::~string((string *)&descriptionBase);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&npotFilenames);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  pTVar13 = (TextureCubeFileCase *)operator_new(0x100);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  TextureCubeFileCase::TextureCubeFileCase
            (pTVar13,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar4->m_renderCtx,pCVar4->m_contextInfo,"etc1_cube_pot",
             "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP",&potFilenames);
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar13);
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar18 = 0; lVar18 != 0x30; lVar18 = lVar18 + 8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"data/etc1/skybox_61x61_",(allocator<char> *)&local_70);
    std::operator+(&descriptionBase,&local_130,*(char **)((long)init::faceExt + lVar18));
    std::operator+(&nameBase,&descriptionBase,".pkm");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&npotFilenames,
               &nameBase);
    std::__cxx11::string::~string((string *)&nameBase);
    std::__cxx11::string::~string((string *)&descriptionBase);
    std::__cxx11::string::~string((string *)&local_130);
  }
  pTVar13 = (TextureCubeFileCase *)operator_new(0x100);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  TextureCubeFileCase::TextureCubeFileCase
            (pTVar13,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar4->m_renderCtx,pCVar4->m_contextInfo,"etc1_cube_npot",
             "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP",&npotFilenames);
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar13);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&npotFilenames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&potFilenames);
  lVar18 = 0x10;
  uVar16 = extraout_RAX;
  while( true ) {
    if (lVar18 == 0x100) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)((long)init::faceExt + lVar18 + 0x20),
               (allocator<char> *)&descriptionBase);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,*(char **)((long)init::faceExt + lVar18 + 0x28),
               (allocator<char> *)&local_130);
    pCVar14 = (Compressed2DFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pRVar3 = pCVar4->m_renderCtx;
    pCVar5 = pCVar4->m_contextInfo;
    std::operator+(&local_130,&descriptionBase,"_2d_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&nameBase,", GL_TEXTURE_2D");
    local_110 = (ulong)*(CompressedTexFormat *)((long)&PTR_anon_var_dwarf_420c75_01e2d7a0 + lVar18);
    Compressed2DFormatCase::Compressed2DFormatCase
              (pCVar14,pTVar2,pRVar3,pCVar5,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               *(CompressedTexFormat *)((long)&PTR_anon_var_dwarf_420c75_01e2d7a0 + lVar18),1,0x80,
               0x40);
    tcu::TestNode::addChild(node_01,(TestNode *)pCVar14);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pCVar15 = (CompressedCubeFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pRVar3 = pCVar4->m_renderCtx;
    pCVar5 = pCVar4->m_contextInfo;
    std::operator+(&local_130,&descriptionBase,"_cube_pot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&nameBase,", GL_TEXTURE_CUBE_MAP");
    CompressedCubeFormatCase::CompressedCubeFormatCase
              (pCVar15,pTVar2,pRVar3,pCVar5,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(CompressedTexFormat)local_110,1,
               0x40,0x40);
    tcu::TestNode::addChild(node_01,(TestNode *)pCVar15);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pCVar14 = (Compressed2DFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pRVar3 = pCVar4->m_renderCtx;
    pCVar5 = pCVar4->m_contextInfo;
    std::operator+(&local_130,&descriptionBase,"_2d_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&nameBase,", GL_TEXTURE_2D");
    Compressed2DFormatCase::Compressed2DFormatCase
              (pCVar14,pTVar2,pRVar3,pCVar5,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(CompressedTexFormat)local_110,1,
               0x33,0x41);
    tcu::TestNode::addChild(node_01,(TestNode *)pCVar14);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    pCVar15 = (CompressedCubeFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    pRVar3 = pCVar4->m_renderCtx;
    pCVar5 = pCVar4->m_contextInfo;
    std::operator+(&local_130,&descriptionBase,"_cube_npot");
    _Var6._M_p = local_130._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&nameBase,", GL_TEXTURE_CUBE_MAP");
    CompressedCubeFormatCase::CompressedCubeFormatCase
              (pCVar15,pTVar2,pRVar3,pCVar5,_Var6._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(CompressedTexFormat)local_110,1,
               0x33,0x33);
    tcu::TestNode::addChild(node_01,(TestNode *)pCVar15);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&descriptionBase);
    uVar16 = std::__cxx11::string::~string((string *)&nameBase);
    lVar18 = lVar18 + 0x18;
  }
  return (int)uVar16;
}

Assistant:

void TextureFormatTests::init (void)
{
	tcu::TestCaseGroup* unsizedGroup	= DE_NULL;
	tcu::TestCaseGroup*	sizedGroup		= DE_NULL;
	tcu::TestCaseGroup* compressedGroup	= DE_NULL;
	addChild((unsizedGroup		= new tcu::TestCaseGroup(m_testCtx, "unsized",		"Unsized formats")));
	addChild((sizedGroup		= new tcu::TestCaseGroup(m_testCtx, "sized",		"Sized formats")));
	addChild((compressedGroup	= new tcu::TestCaseGroup(m_testCtx, "compressed",	"Compressed formats")));

	tcu::TestCaseGroup*	sized2DGroup		= DE_NULL;
	tcu::TestCaseGroup*	sizedCubeGroup		= DE_NULL;
	tcu::TestCaseGroup*	sized2DArrayGroup	= DE_NULL;
	tcu::TestCaseGroup*	sized3DGroup		= DE_NULL;
	sizedGroup->addChild((sized2DGroup			= new tcu::TestCaseGroup(m_testCtx, "2d",			"Sized formats (2D)")));
	sizedGroup->addChild((sizedCubeGroup		= new tcu::TestCaseGroup(m_testCtx, "cube",			"Sized formats (Cubemap)")));
	sizedGroup->addChild((sized2DArrayGroup		= new tcu::TestCaseGroup(m_testCtx, "2d_array",		"Sized formats (2D Array)")));
	sizedGroup->addChild((sized3DGroup			= new tcu::TestCaseGroup(m_testCtx, "3d",			"Sized formats (3D)")));

	struct
	{
		const char*	name;
		deUint32		format;
		deUint32		dataType;
	} texFormats[] =
	{
		{ "alpha",							GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance",						GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance_alpha",				GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_unsigned_short_5_6_5",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb_unsigned_byte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_unsigned_short_4_4_4_4",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_unsigned_short_5_5_5_1",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba_unsigned_byte",				GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string	nameBase		= texFormats[formatNdx].name;
		string	descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		unsizedGroup->addChild(new Texture2DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_pot").c_str(),			(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType, 128, 128));
		unsizedGroup->addChild(new Texture2DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType,  63, 112));
		unsizedGroup->addChild(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  64,  64));
		unsizedGroup->addChild(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  57,  57));
		unsizedGroup->addChild(new Texture2DArrayFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_array_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	format, dataType,  64,  64,  8));
		unsizedGroup->addChild(new Texture2DArrayFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_array_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	format, dataType,  63,  57,  7));
		unsizedGroup->addChild(new Texture3DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_3d_pot").c_str(),			(descriptionBase + ", GL_TEXTURE_3D").c_str(),			format, dataType,   8,  32, 16));
		unsizedGroup->addChild(new Texture3DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_3d_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_3D").c_str(),			format, dataType,  11,  31,  7));
	}

	struct
	{
		const char*	name;
		deUint32		internalFormat;
	} sizedColorFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	struct
	{
		const char*	name;
		deUint32		internalFormat;
	} sizedDepthStencilFormats[] =
	{
		// Depth and stencil formats
		{ "depth_component32f",	GL_DEPTH_COMPONENT32F	},
		{ "depth_component24",	GL_DEPTH_COMPONENT24	},
		{ "depth_component16",	GL_DEPTH_COMPONENT16	},
		{ "depth32f_stencil8",	GL_DEPTH32F_STENCIL8	},
		{ "depth24_stencil8",	GL_DEPTH24_STENCIL8		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedColorFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedColorFormats[formatNdx].internalFormat;
		string	nameBase		= sizedColorFormats[formatNdx].name;
		string	descriptionBase	= glu::getTextureFormatName(internalFormat);

		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat, 128, 128));
		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat,  63, 112));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  64,  64));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  57,  57));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  64,  64,  8));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  63,  57,  7));
		sized3DGroup->addChild		(new Texture3DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_3D").c_str(),			internalFormat,   8,  32, 16));
		sized3DGroup->addChild		(new Texture3DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_3D").c_str(),			internalFormat,  11,  31,  7));
	}

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedDepthStencilFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedDepthStencilFormats[formatNdx].internalFormat;
		string	nameBase		= sizedDepthStencilFormats[formatNdx].name;
		string	descriptionBase	= glu::getTextureFormatName(internalFormat);

		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat, 128, 128));
		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat,  63, 112));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  64,  64));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  57,  57));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  64,  64,  8));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  63,  57,  7));
	}

	// ETC-1 compressed formats.
	{
		static const char* filenames[] =
		{
			"data/etc1/photo_helsinki_mip_0.pkm",
			"data/etc1/photo_helsinki_mip_1.pkm",
			"data/etc1/photo_helsinki_mip_2.pkm",
			"data/etc1/photo_helsinki_mip_3.pkm",
			"data/etc1/photo_helsinki_mip_4.pkm",
			"data/etc1/photo_helsinki_mip_5.pkm",
			"data/etc1/photo_helsinki_mip_6.pkm",
			"data/etc1/photo_helsinki_mip_7.pkm"
		};
		compressedGroup->addChild(new Texture2DFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", toStringVector(filenames, DE_LENGTH_OF_ARRAY(filenames))));
	}

	{
		vector<string> filenames;
		filenames.push_back("data/etc1/photo_helsinki_113x89.pkm");
		compressedGroup->addChild(new Texture2DFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_npot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", filenames));
	}

	{
		static const char* faceExt[] = { "neg_x", "pos_x", "neg_y", "pos_y", "neg_z", "pos_z" };

		const int		potNumLevels	= 7;
		vector<string>	potFilenames;
		for (int level = 0; level < potNumLevels; level++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				potFilenames.push_back(string("data/etc1/skybox_") + faceExt[face] + "_mip_" + de::toString(level) + ".pkm");

		compressedGroup->addChild(new TextureCubeFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP", potFilenames));

		vector<string> npotFilenames;
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			npotFilenames.push_back(string("data/etc1/skybox_61x61_") + faceExt[face] + ".pkm");

		compressedGroup->addChild(new TextureCubeFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_npot", "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP", npotFilenames));
	}

	// ETC-2 and EAC compressed formats.
	struct {
		const char*					descriptionBase;
		const char*					nameBase;
		tcu::CompressedTexFormat	format;
	} etc2Formats[] =
	{
		{ "GL_COMPRESSED_R11_EAC",							"eac_r11",							tcu::COMPRESSEDTEXFORMAT_EAC_R11,							},
		{ "GL_COMPRESSED_SIGNED_R11_EAC",					"eac_signed_r11",					tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11,					},
		{ "GL_COMPRESSED_RG11_EAC",							"eac_rg11",							tcu::COMPRESSEDTEXFORMAT_EAC_RG11,							},
		{ "GL_COMPRESSED_SIGNED_RG11_EAC",					"eac_signed_rg11",					tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11,					},
		{ "GL_COMPRESSED_RGB8_ETC2",						"etc2_rgb8",						tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8,							},
		{ "GL_COMPRESSED_SRGB8_ETC2",						"etc2_srgb8",						tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8,						},
		{ "GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2",	"etc2_rgb8_punchthrough_alpha1",	tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1,		},
		{ "GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2",	"etc2_srgb8_punchthrough_alpha1",	tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1,	},
		{ "GL_COMPRESSED_RGBA8_ETC2_EAC",					"etc2_eac_rgba8",					tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8,					},
		{ "GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC",			"etc2_eac_srgb8_alpha8",			tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8,				}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
	{
		string descriptionBase	= etc2Formats[formatNdx].descriptionBase;
		string nameBase			= etc2Formats[formatNdx].nameBase;

		compressedGroup->addChild(new Compressed2DFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_2d_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			etc2Formats[formatNdx].format,	1,	128,	64));
		compressedGroup->addChild(new CompressedCubeFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	etc2Formats[formatNdx].format,	1,	64,		64));
		compressedGroup->addChild(new Compressed2DFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_2d_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			etc2Formats[formatNdx].format,	1,	51,		65));
		compressedGroup->addChild(new CompressedCubeFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	etc2Formats[formatNdx].format,	1,	51,		51));
	}


}